

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_prefix_coding.cpp
# Opt level: O3

bool crnlib::prefix_coding::limit_max_code_size(uint num_syms,uint8 *pCodesizes,uint max_code_size)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint i;
  uint uVar4;
  long lVar5;
  uint8 *__s;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint num_codes [35];
  uint next_sorted_ofs [35];
  uint8 new_codesizes [8192];
  uint local_2158 [72];
  uint8 local_2038 [8200];
  
  if (max_code_size - 0x23 < 0xffffffde || num_syms - 0x2001 < 0xffffe000) {
    return false;
  }
  uVar10 = 0;
  memset(local_2158,0,0x8c);
  bVar3 = false;
  do {
    bVar6 = pCodesizes[uVar10];
    if (bVar6 != 0) {
      local_2158[(uint)bVar6] = local_2158[(uint)bVar6] + 1;
      bVar3 = (bool)(bVar3 | max_code_size < bVar6);
    }
    uVar10 = uVar10 + 1;
  } while (num_syms != uVar10);
  if (!bVar3) {
    return true;
  }
  uVar8 = 0;
  lVar5 = 1;
  do {
    local_2158[lVar5 + 0x24] = uVar8;
    uVar8 = uVar8 + local_2158[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x23);
  if (uVar8 - 0x2001 < 0xffffe001) {
    return true;
  }
  uVar4 = 1 << ((byte)max_code_size & 0x1f);
  if (uVar4 < uVar8) {
    return false;
  }
  uVar10 = (ulong)max_code_size;
  if (max_code_size < 0x22) {
    uVar8 = local_2158[uVar10];
    lVar5 = uVar10 + 1;
    do {
      uVar8 = uVar8 + local_2158[lVar5];
      local_2158[uVar10] = uVar8;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x23);
    if (max_code_size == 0) {
      bVar3 = true;
      uVar8 = 0;
      goto LAB_0019db18;
    }
  }
  bVar6 = 0;
  uVar8 = 0;
  uVar7 = uVar10;
  do {
    uVar9 = uVar7 - 1;
    uVar8 = uVar8 + (local_2158[uVar7] << (bVar6 & 0x1f));
    bVar6 = bVar6 + 1;
    uVar7 = uVar9;
  } while ((int)uVar9 != 0);
  if (uVar8 == uVar4) {
    return true;
  }
  bVar3 = false;
LAB_0019db18:
  do {
    local_2158[uVar10] = local_2158[uVar10] - 1;
    uVar2 = max_code_size - 1;
    do {
      uVar1 = uVar2;
      if (uVar1 == 0) {
        return false;
      }
      uVar2 = uVar1 - 1;
    } while (local_2158[uVar1] == 0);
    local_2158[uVar1] = local_2158[uVar1] - 1;
    local_2158[uVar1 + 1] = local_2158[uVar1 + 1] + 2;
    uVar8 = uVar8 - 1;
  } while (uVar8 != uVar4);
  if (!bVar3) {
    __s = local_2038;
    uVar10 = 1;
    do {
      uVar7 = (ulong)local_2158[uVar10];
      if (uVar7 != 0) {
        memset(__s,(int)uVar10,uVar7);
        __s = __s + uVar7;
      }
      uVar10 = uVar10 + 1;
    } while (max_code_size + 1 != uVar10);
  }
  uVar10 = 0;
  do {
    uVar7 = (ulong)pCodesizes[uVar10];
    if (uVar7 != 0) {
      uVar8 = local_2158[uVar7 + 0x24];
      local_2158[uVar7 + 0x24] = uVar8 + 1;
      pCodesizes[uVar10] = local_2038[uVar8];
    }
    uVar10 = uVar10 + 1;
  } while (num_syms != uVar10);
  return true;
}

Assistant:

bool limit_max_code_size(uint num_syms, uint8* pCodesizes, uint max_code_size) {
  const uint cMaxEverCodeSize = 34;

  if ((!num_syms) || (num_syms > cMaxSupportedSyms) || (max_code_size < 1) || (max_code_size > cMaxEverCodeSize))
    return false;

  uint num_codes[cMaxEverCodeSize + 1];
  utils::zero_object(num_codes);

  bool should_limit = false;

  for (uint i = 0; i < num_syms; i++) {
    uint c = pCodesizes[i];
    if (c) {
      CRNLIB_ASSERT(c <= cMaxEverCodeSize);

      num_codes[c]++;
      if (c > max_code_size)
        should_limit = true;
    }
  }

  if (!should_limit)
    return true;

  uint ofs = 0;
  uint next_sorted_ofs[cMaxEverCodeSize + 1];
  for (uint i = 1; i <= cMaxEverCodeSize; i++) {
    next_sorted_ofs[i] = ofs;
    ofs += num_codes[i];
  }

  if ((ofs < 2) || (ofs > cMaxSupportedSyms))
    return true;

  if (ofs > (1U << max_code_size))
    return false;

  for (uint i = max_code_size + 1; i <= cMaxEverCodeSize; i++)
    num_codes[max_code_size] += num_codes[i];

  // Technique of adjusting tree to enforce maximum code size from LHArc.

  uint total = 0;
  for (uint i = max_code_size; i; --i)
    total += (num_codes[i] << (max_code_size - i));

  if (total == (1U << max_code_size))
    return true;

  do {
    num_codes[max_code_size]--;

    uint i;
    for (i = max_code_size - 1; i; --i) {
      if (!num_codes[i])
        continue;
      num_codes[i]--;
      num_codes[i + 1] += 2;
      break;
    }
    if (!i)
      return false;

    total--;
  } while (total != (1U << max_code_size));

  uint8 new_codesizes[cMaxSupportedSyms];
  uint8* p = new_codesizes;
  for (uint i = 1; i <= max_code_size; i++) {
    uint n = num_codes[i];
    if (n) {
      memset(p, i, n);
      p += n;
    }
  }

  for (uint i = 0; i < num_syms; i++) {
    const uint c = pCodesizes[i];
    if (c) {
      uint ofs = next_sorted_ofs[c];
      next_sorted_ofs[c] = ofs + 1;

      pCodesizes[i] = static_cast<uint8>(new_codesizes[ofs]);
    }
  }

  return true;
}